

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

char * jsonnet_evaluate_snippet(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_evaluate_snippet_aux(vm,filename,snippet,error,REGULAR);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_snippet(JsonnetVm *vm, const char *filename, const char *snippet, int *error)
{
    TRY
        return jsonnet_evaluate_snippet_aux(vm, filename, snippet, error, REGULAR);
    CATCH("jsonnet_evaluate_snippet")
    return nullptr;  // Never happens.
}